

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing2_640x480at60_25.175MHz_Dice.c
# Opt level: O0

void displayLine(void)

{
  undefined4 local_18;
  undefined4 local_14;
  int i_3;
  int i_2;
  int i_1;
  int i;
  
  line_cnt = ((byte)line & 7) << 4;
  for (i_2 = 0; i_2 < 0x28; i_2 = i_2 + 1) {
    putchar(line_cnt | 0xf);
  }
  line = line + 1;
  line_cnt = ((byte)line & 7) << 4;
  for (i_3 = 0; i_3 < 1; i_3 = i_3 + 1) {
    putchar(line_cnt | 0xd);
  }
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    putchar(line_cnt | 9);
  }
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    putchar(line_cnt | 0xd);
  }
  return;
}

Assistant:

void displayLine() {


    // This is very bad design.  Global Variable and spooky action at a distance.
    line_cnt = line;
    line_cnt = line_cnt<<4;
    line_cnt = line_cnt&0b01110000;

    // Display
    for(int i=0; i<(640/16); i++) {
        putchar(0b00001111|line_cnt);
    }

    // Count ahead
    line++;
    line_cnt = line;
    line_cnt = line_cnt<<4;
    line_cnt = line_cnt&0b01110000;

    // Front Porch
    for(int i=0; i<(16/16); i++) {
        putchar(0b00001101|line_cnt);
    }

    // hSync
    for(int i=0; i<(96/16); i++) {
        putchar(0b00001001|line_cnt);
    }

    // Back Porch
    for(int i=0; i<(48/16); i++) {
        putchar(0b00001101|line_cnt);
    }

}